

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int __how;
  int *__rep;
  actor_ref *this;
  int local_54;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  msg_finish local_41;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  actor_ref local_28;
  actor_ref wall;
  uint j;
  actor_ref console;
  uint i;
  
  console.object_._4_4_ = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Balls    : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Duration : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2000);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Players  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,10000);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  for (console.object_._0_4_ = 1; (uint)console.object_ < 4;
      console.object_._0_4_ = (uint)console.object_ + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"--- ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)console.object_);
    poVar1 = std::operator<<(poVar1," : start acto ---");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    acto::spawn<Console>((acto *)&stack0xffffffffffffffe8,bind);
    for (wall.object_._4_4_ = 0; wall.object_._4_4_ == 0;
        wall.object_._4_4_ = wall.object_._4_4_ + 1) {
      acto::spawn<Wall>();
      acto::actor_ref::send<msg_out,char_const(&)[11]>
                ((actor_ref *)&stack0xffffffffffffffe8,(char (*) [11])"send start");
      acto::actor_ref::send<msg_start,int_const&,acto::actor_ref&>
                (&local_28,&BALLS,(actor_ref *)&stack0xffffffffffffffe8);
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_40,&DURATION);
      acto::this_thread::sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>(local_40);
      acto::actor_ref::send<msg_finish>(&local_28,&local_41);
      acto::join(&local_28);
      acto::this_thread::process_messages();
      acto::actor_ref::~actor_ref(&local_28);
    }
    local_54 = 1000;
    __rep = &local_54;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_50,__rep);
    __how = (int)__rep;
    acto::this_thread::sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>(local_50);
    this = (actor_ref *)&stack0xffffffffffffffe8;
    acto::actor_ref::~actor_ref(this);
    acto::shutdown((int)this,__how);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- end acto ---");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,": end");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  std::cout << "Balls    : " << BALLS    << std::endl;
  std::cout << "Duration : " << DURATION << std::endl;
  std::cout << "Players  : " << PLAYERS  << std::endl;
  std::cout << std::endl;

  for (unsigned int i = 1; i < 4; i++) {
    std::cout << "--- " << i << " : start acto ---" << std::endl;
    {
      // Создать консоль.
      // Все актеры должны создаваться с использованием шаблона act_o::spawn<>.
      // Использование оператора new недопустимо.
      acto::actor_ref console = acto::spawn< Console >(acto::actor_thread::bind);

      for(unsigned int j = 0; j < 1; j++) {
        // Создать стену.
        // Опция "acto::aoExclusive" создает для объекта отдельный поток,
        // в котором будут выполнятся все обработчики этого объекта
        acto::actor_ref wall = acto::spawn< Wall >();

        // -
        console.send< msg_out >("send start");

        // Начать игру: инициализировать объект, запустить мячи
        wall.send< msg_start >(BALLS, console);

        // Игра продолжается некоторое время в независимых потоках
        acto::this_thread::sleep_for(std::chrono::milliseconds(DURATION));

        // Остановить игру
        wall.send(msg_finish());

        // Дождаться завершения выполнения
        acto::join(wall);

        // Обработать сообщения для консоли
        acto::this_thread::process_messages();
      }
      acto::this_thread::sleep_for(std::chrono::milliseconds(1000));
    }
    // По зовершении работы библиотеки необходимо вызвать эту функцию,
    // чтобы освободить все занимаемые ресурсы.
    acto::shutdown();
    // -
    std::cout << "--- end acto ---" << std::endl;
  }

  // Выполнение программы закончено
  std::cout << ": end" << std::endl;
#ifdef ACTO_WIN
  _getch();
#endif
  // -
  return 0;
}